

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_plot_function(nk_context *ctx,nk_chart_type type,void *userdata,
                     _func_float_void_ptr_int *value_getter,int count,int offset)

{
  nk_bool nVar1;
  int iVar2;
  nk_chart *__s;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  float max_value;
  float fVar7;
  
  if (count != 0 && (value_getter != (_func_float_void_ptr_int *)0x0 && ctx != (nk_context *)0x0)) {
    fVar6 = (*value_getter)(userdata,offset);
    max_value = fVar6;
    fVar7 = fVar6;
    iVar2 = offset;
    iVar3 = count;
    if (0 < count) {
      do {
        fVar6 = (*value_getter)(userdata,iVar2);
        if (max_value <= fVar6) {
          max_value = fVar6;
        }
        if (fVar7 <= fVar6) {
          fVar6 = fVar7;
        }
        iVar3 = iVar3 + -1;
        fVar7 = fVar6;
        iVar2 = iVar2 + 1;
      } while (iVar3 != 0);
    }
    nVar1 = nk_chart_begin_colored
                      (ctx,type,(ctx->style).chart.color,(ctx->style).chart.selected_color,count,
                       fVar6,max_value);
    if (nVar1 != 0) {
      if (0 < count) {
        do {
          fVar6 = (*value_getter)(userdata,offset);
          nk_chart_push_slot(ctx,fVar6,0);
          offset = offset + 1;
          count = count + -1;
        } while (count != 0);
      }
      if (ctx->current != (nk_window *)0x0) {
        __s = &ctx->current->layout->chart;
        uVar4 = (ulong)__s & 3;
        if (uVar4 == 0) {
          uVar5 = 0xb4;
        }
        else {
          memset(__s,0,4 - uVar4);
          uVar5 = uVar4 | 0xb0;
          __s = (nk_chart *)((long)__s + (4 - uVar4));
        }
        uVar4 = (ulong)((uint)uVar5 & 0xfffffffc);
        memset(__s,0,uVar4);
        if ((uVar5 & 3) != 0) {
          memset((void *)((long)__s->slots + (uVar4 - 0x14)),0,uVar5 & 3);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_plot_function(struct nk_context *ctx, enum nk_chart_type type, void *userdata,
float(*value_getter)(void* user, int index), int count, int offset)
{
int i = 0;
float min_value;
float max_value;

NK_ASSERT(ctx);
NK_ASSERT(value_getter);
if (!ctx || !value_getter || !count) return;

max_value = min_value = value_getter(userdata, offset);
for (i = 0; i < count; ++i) {
float value = value_getter(userdata, i + offset);
min_value = NK_MIN(value, min_value);
max_value = NK_MAX(value, max_value);
}

if (nk_chart_begin(ctx, type, count, min_value, max_value)) {
for (i = 0; i < count; ++i)
nk_chart_push(ctx, value_getter(userdata, i + offset));
nk_chart_end(ctx);
}
}